

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaDedicatedAllocationList::AddStatistics
          (VmaDedicatedAllocationList *this,VmaStatistics *inoutStats)

{
  size_t sVar1;
  int *in_RSI;
  VmaMutexLockRead *in_RDI;
  VkDeviceSize size;
  ItemType *item;
  uint32_t allocCount;
  VmaMutexLockRead lock;
  VmaMutexLockRead *in_stack_ffffffffffffffa0;
  VmaRWMutex *in_stack_ffffffffffffffa8;
  VmaAllocation_T *local_38;
  
  VmaMutexLockRead::VmaMutexLockRead
            (in_RDI,in_stack_ffffffffffffffa8,SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  sVar1 = VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits>::GetCount
                    ((VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits> *)(in_RDI + 8));
  *in_RSI = *in_RSI + (int)sVar1;
  in_RSI[1] = in_RSI[1] + (int)sVar1;
  local_38 = VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits>::Front
                       ((VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits> *)(in_RDI + 8)
                       );
  while (local_38 != (VmaAllocation_T *)0x0) {
    in_stack_ffffffffffffffa0 = (VmaMutexLockRead *)VmaAllocation_T::GetSize(local_38);
    *(long *)(in_RSI + 2) = (long)&in_stack_ffffffffffffffa0->m_pMutex + *(long *)(in_RSI + 2);
    *(long *)(in_RSI + 4) = (long)&in_stack_ffffffffffffffa0->m_pMutex + *(long *)(in_RSI + 4);
    local_38 = VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits>::GetNext
                         ((ItemType *)0x2eb54d);
  }
  VmaMutexLockRead::~VmaMutexLockRead(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void VmaDedicatedAllocationList::AddStatistics(VmaStatistics& inoutStats)
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);

    const uint32_t allocCount = (uint32_t)m_AllocationList.GetCount();
    inoutStats.blockCount += allocCount;
    inoutStats.allocationCount += allocCount;

    for(auto* item = m_AllocationList.Front(); item != nullptr; item = DedicatedAllocationLinkedList::GetNext(item))
    {
        const VkDeviceSize size = item->GetSize();
        inoutStats.blockBytes += size;
        inoutStats.allocationBytes += size;
    }
}